

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForcePlateInfo.h
# Opt level: O1

void __thiscall ViconCGStream::VForcePlateInfo::Write(VForcePlateInfo *this,VBuffer *i_rBuffer)

{
  ViconCGStreamIO::VBufferImpl::WritePod<unsigned_int>(&i_rBuffer->m_BufferImpl,&this->m_DeviceID);
  ViconCGStreamIO::VBufferImpl::WritePodArray<float>
            (&i_rBuffer->m_BufferImpl,this->m_WorldTranslation,3);
  ViconCGStreamIO::VBufferImpl::WritePodArray<float>
            (&i_rBuffer->m_BufferImpl,this->m_WorldRotation,9);
  ViconCGStreamIO::VBufferImpl::WritePodArray<float>(&i_rBuffer->m_BufferImpl,this->m_Bounds,6);
  ViconCGStreamIO::VBufferImpl::WritePodArray<float>
            (&i_rBuffer->m_BufferImpl,this->m_LocalTranslation,3);
  ViconCGStreamIO::VBufferImpl::WritePodArray<float>
            (&i_rBuffer->m_BufferImpl,this->m_LocalRotation,9);
  return;
}

Assistant:

virtual void Write( ViconCGStreamIO::VBuffer & i_rBuffer ) const
  {
    i_rBuffer.Write( m_DeviceID );
    i_rBuffer.Write( m_WorldTranslation );
    i_rBuffer.Write( m_WorldRotation );
    i_rBuffer.Write( m_Bounds );
    i_rBuffer.Write( m_LocalTranslation );
    i_rBuffer.Write( m_LocalRotation );
  }